

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosixSocketCommon.cpp
# Opt level: O1

void PosixSocketCommon::clearBuffer(int socket_fd,sockaddr *class_rfa,socklen_t class_rfa_size)

{
  int iVar1;
  ssize_t sVar2;
  char buf;
  pollfd polldata;
  undefined1 local_3d;
  socklen_t local_3c;
  pollfd local_38;
  
  local_38.events = 1;
  local_38.fd = socket_fd;
  while( true ) {
    iVar1 = poll(&local_38,1,0);
    if (iVar1 == -1) {
      return;
    }
    if (local_38.revents == 0) break;
    local_3c = class_rfa_size;
    fcntl(socket_fd,3);
    sVar2 = recvfrom(socket_fd,&local_3d,1,0,(sockaddr *)class_rfa,&local_3c);
    if ((int)sVar2 < 1) {
      return;
    }
  }
  return;
}

Assistant:

void PosixSocketCommon::clearBuffer(int       socket_fd,
                                    sockaddr* class_rfa,
                                    socklen_t class_rfa_size)
{
    // Interested if data is available
    pollfd polldata;
    polldata.fd = socket_fd;
    polldata.events = POLLIN;

    char buf;

    while(true)
    {
        // Poll the socket and see if there is data
        if (poll(&polldata, 1, 0) == -1)
        {
#if defined DEBUG
            perror("PosixSocketCommon::clearBuffer");
#endif
            return;
        }

        // If no data available, leave
        if (polldata.revents == 0)
        {
            return;
        }

        // Read a byte, leave if error
        if (read(socket_fd, &buf, 1, 0, class_rfa, class_rfa_size)
            < 1)
        {
            return;
        }
    }
}